

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void __thiscall
HashTable<ObjTypeGuardBucket,Memory::ArenaAllocator>::
Or<ObjTypeGuardBucket(*)(ObjTypeGuardBucket,ObjTypeGuardBucket)>
          (HashTable<ObjTypeGuardBucket,Memory::ArenaAllocator> *this,
          HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this2,
          _func_ObjTypeGuardBucket_ObjTypeGuardBucket_ObjTypeGuardBucket *fn)

{
  int iVar1;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  code *pcVar4;
  undefined4 *puVar5;
  bool bVar6;
  Type *pTVar7;
  Type *pTVar8;
  Type *pTVar9;
  long lVar10;
  ObjTypeGuardBucket OVar11;
  undefined1 local_a0 [8];
  EditingIterator iter;
  ObjTypeGuardBucket local_78;
  JITTypeHolder local_68;
  ulong local_60;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *local_58;
  HashTable<ObjTypeGuardBucket,Memory::ArenaAllocator> *local_50;
  undefined4 *local_48;
  undefined1 local_40 [8];
  Iterator iter2;
  
  local_58 = this2;
  local_50 = this;
  local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_60 = 0;
LAB_003d7dda:
  if (*(uint *)(local_50 + 8) <= local_60) {
    return;
  }
  lVar10 = local_60 * 0x10;
  iter2.list = local_58->table + local_60;
  local_40 = (undefined1  [8])iter2.list;
  if (iter2.list == (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = local_48;
    *local_48 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar6) {
LAB_003d814c:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar5 = 0;
  }
  pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
           ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
  iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
  if ((undefined1  [8])pSVar2 != local_40) {
    iter2.list = pSVar2;
  }
  local_a0 = (undefined1  [8])(lVar10 + *(long *)(local_50 + 0x10));
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list =
       (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)local_a0;
  while (bVar6 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                 EditingIterator::Next((EditingIterator *)local_a0), bVar6) {
    pTVar7 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_a0);
    while (((iter2.list !=
             (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0 &&
            ((undefined1  [8])iter2.list != local_40)) &&
           (iVar1 = pTVar7->value,
           pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)local_40), iVar1 < pTVar8->value))) {
      pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
               EditingIterator::InsertNodeBefore
                         ((EditingIterator *)local_a0,*(ArenaAllocator **)local_50);
      pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)local_40);
      pTVar8->value = pTVar9->value;
      ObjTypeGuardBucket::ObjTypeGuardBucket
                ((ObjTypeGuardBucket *)&iter.last,(BVSparse<Memory::JitArenaAllocator> *)0x0);
      pTVar9 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)local_40);
      OVar11 = (*fn)(stack0xffffffffffffff78,pTVar9->element);
      pTVar8->element = OVar11;
      if (iter2.list ==
          (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = local_48;
        *local_48 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_003d814c;
        *puVar5 = 0;
      }
      pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
    }
    if ((iter2.list ==
         (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
       ((undefined1  [8])iter2.list == local_40)) break;
    iVar1 = pTVar7->value;
    pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    if (iVar1 == pTVar8->value) {
      pBVar3 = (pTVar7->element).guardedPropertyOps;
      local_68.t = (pTVar7->element).monoGuardType.t;
      pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)local_40);
      OVar11.monoGuardType.t = local_68.t;
      OVar11.guardedPropertyOps = pBVar3;
      OVar11 = (*fn)(OVar11,pTVar8->element);
      pTVar7->element = OVar11;
      if (iter2.list ==
          (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = local_48;
        *local_48 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) goto LAB_003d814c;
        *puVar5 = 0;
      }
      pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
    }
  }
  do {
    if ((iter2.list ==
         (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
       ((undefined1  [8])iter2.list == local_40)) break;
    pTVar7 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
             EditingIterator::InsertNodeBefore
                       ((EditingIterator *)local_a0,*(ArenaAllocator **)local_50);
    pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    pTVar7->value = pTVar8->value;
    ObjTypeGuardBucket::ObjTypeGuardBucket(&local_78,(BVSparse<Memory::JitArenaAllocator> *)0x0);
    pTVar8 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    OVar11 = (*fn)(local_78,pTVar8->element);
    pTVar7->element = OVar11;
    if (iter2.list ==
        (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = local_48;
      *local_48 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) goto LAB_003d814c;
      *puVar5 = 0;
    }
    pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
             ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    iter2.list = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if ((undefined1  [8])pSVar2 != local_40) {
      iter2.list = pSVar2;
    }
  } while( true );
  local_60 = local_60 + 1;
  goto LAB_003d7dda;
}

Assistant:

void Or(HashTable<T> * this2, Fn fn)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                    newBucket->value = iter2.Data().value;
                    newBucket->element = fn(nullptr, iter2.Data().element);
                    iter2.Next();
                }

                if (!iter2.IsValid())
                {
                    break;
                }
                if (bucket.value == iter2.Data().value)
                {
                    bucket.element = fn(bucket.element, iter2.Data().element);
                    iter2.Next();
                }
            } NEXT_SLISTBASE_ENTRY_EDITING;

            while (iter2.IsValid())
            {
                Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                newBucket->value = iter2.Data().value;
                newBucket->element = fn(nullptr, iter2.Data().element);
                iter2.Next();
            }
        }
    }